

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_mdl.h
# Opt level: O1

void __thiscall
ExampleModel::
WriteConExpr<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::ExprArgWriter>
          (ExampleModel *this,int i,ExprArgWriter *ew)

{
  File *f;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *this_00;
  double r;
  
  if (i == 2) {
    ew->nargs_ = ew->nargs_ + -1;
    this_00 = ew->nlw_;
    f = &this_00->nm;
    r = 0.0;
  }
  else if (i == 1) {
    ew->nargs_ = ew->nargs_ + -1;
    this_00 = ew->nlw_;
    f = &this_00->nm;
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"o%d\t#%s\n",0,"+");
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"o%d\t#%s\n",2,"*");
    mp::TextFormatter::nput(&this_00->super_FormatterType,f,-38.2);
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"o%d\t#%s\n",5,"^");
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"v%d\t#%s\n",0,"y");
    mp::TextFormatter::nput(&this_00->super_FormatterType,f,2.0);
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"o%d\t#%s\n",2,"*");
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"o%d\t#%s\n",2,"*");
    mp::TextFormatter::nput(&this_00->super_FormatterType,f,109.0);
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"o%d\t#%s\n",0x29,"sin");
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"v%d\t#%s\n",3,"t2");
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"o%d\t#%s\n",0,"+");
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"v%d\t#%s\n",5,"t1");
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"o%d\t#%s\n",5,"^");
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"v%d\t#%s\n",4,"t3");
    r = 1.5;
  }
  else {
    if (i != 0) {
      return;
    }
    ew->nargs_ = ew->nargs_ + -1;
    this_00 = ew->nlw_;
    f = &this_00->nm;
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"o%d\t#%s\n",2,"*");
    mp::TextFormatter::nput(&this_00->super_FormatterType,f,5.0);
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"o%d\t#%s\n",5,"^");
    mp::TextFormatter::apr(&this_00->super_FormatterType,f,"v%d\t#%s\n",3,"t2");
    r = 2.0;
  }
  mp::TextFormatter::nput(&this_00->super_FormatterType,f,r);
  return;
}

Assistant:

void WriteConExpr(int i, EWriter& ew) const {
    using namespace mp::nl;
    switch (i) {
    case 0:                  // C1_t2
    {
      auto ew01 = ew.OPut2(MUL);
      ew01.NPut(5);
      {
        auto ew0101 = ew01.OPut2(POW);
        ew0101.VPut(3, "t2");
        ew0101.NPut(2);
      }
    } break;
    case 1:                  // C2_t1t2t3
    {
      auto ew01 = ew.OPut2(ADD);
      {
        auto ew0101 = ew01.OPut2(MUL);
        ew0101.NPut(-38.2);
        {
          auto ew010101 = ew0101.OPut2(POW);
          ew010101.VPut(0, "y");
          ew010101.NPut(2);
        }
      }
      {
        auto ew0102 = ew01.OPut2(MUL);
        {
          auto ew010201 = ew0102.OPut2(MUL);
          ew010201.NPut(109);
          {
            auto ew01020101 = ew010201.OPut1(SIN);
            ew01020101.VPut(3, "t2");
          }
        }
        {
          auto ew010202 = ew0102.OPut2(ADD.code, ADD.name);
          ew010202.VPut(5, "t1");
          {
            auto ew01020201 = ew010202.OPut2(POW);
            ew01020201.VPut(4, "t3");
            ew01020201.NPut(1.5);
          }
        }
      }
    } break;
    case 2:                  // C0_lin
      ew.NPut(0);            // no non-linear part
      break;
    default:
      assert(false);
    {}
    }
  }